

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O0

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::vine_swap(RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
            *this,Pos_index index)

{
  bool bVar1;
  bool bVar2;
  Index IVar3;
  Dimension DVar4;
  Dimension DVar5;
  ID_index IVar6;
  Master_RU_matrix *pMVar7;
  invalid_argument *this_00;
  bool iiIsPositive;
  bool iIsPositive;
  Pos_index index_local;
  RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
  *this_local;
  
  pMVar7 = _matrix(this);
  IVar3 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
          ::get_number_of_columns(&pMVar7->reducedMatrixR_);
  if (IVar3 - 1 <= index) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"RU_vine_swap::vine_swap - Index to swap out of bound.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pMVar7 = _matrix(this);
  bVar1 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
          ::is_zero_column(&pMVar7->reducedMatrixR_,index);
  pMVar7 = _matrix(this);
  bVar2 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
          ::is_zero_column(&pMVar7->reducedMatrixR_,index + 1);
  if ((bVar1) && (bVar2)) {
    pMVar7 = _matrix(this);
    DVar4 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
            ::get_column_dimension(&pMVar7->reducedMatrixR_,index);
    pMVar7 = _matrix(this);
    DVar5 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
            ::get_column_dimension(&pMVar7->reducedMatrixR_,index + 1);
    if (DVar4 == DVar5) {
      pMVar7 = _matrix(this);
      IVar6 = _get_row_id_from_position(this,index + 1);
      bVar1 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
              ::is_zero_entry(&pMVar7->mirrorMatrixU_,index,IVar6);
      if (!bVar1) {
        pMVar7 = _matrix(this);
        IVar6 = _get_row_id_from_position(this,index + 1);
        Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
        ::zero_entry(&pMVar7->mirrorMatrixU_,index,IVar6);
      }
      this_local._7_1_ = _positive_vine_swap(this,index);
    }
    else {
      _positive_transpose(this,index);
      _swap_at_index(this,index);
      this_local._7_1_ = true;
    }
  }
  else if ((bVar1) || (bVar2)) {
    if ((!bVar1) || (bVar2)) {
      pMVar7 = _matrix(this);
      DVar4 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
              ::get_column_dimension(&pMVar7->reducedMatrixR_,index);
      pMVar7 = _matrix(this);
      DVar5 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
              ::get_column_dimension(&pMVar7->reducedMatrixR_,index + 1);
      if (DVar4 == DVar5) {
        pMVar7 = _matrix(this);
        IVar6 = _get_row_id_from_position(this,index + 1);
        bVar1 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
                ::is_zero_entry(&pMVar7->mirrorMatrixU_,index,IVar6);
        if (!bVar1) {
          bVar1 = _negative_positive_vine_swap(this,index);
          return bVar1;
        }
      }
      _negative_positive_transpose(this,index);
      _swap_at_index(this,index);
      this_local._7_1_ = true;
    }
    else {
      pMVar7 = _matrix(this);
      DVar4 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
              ::get_column_dimension(&pMVar7->reducedMatrixR_,index);
      pMVar7 = _matrix(this);
      DVar5 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
              ::get_column_dimension(&pMVar7->reducedMatrixR_,index + 1);
      if (DVar4 == DVar5) {
        pMVar7 = _matrix(this);
        IVar6 = _get_row_id_from_position(this,index + 1);
        bVar1 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
                ::is_zero_entry(&pMVar7->mirrorMatrixU_,index,IVar6);
        if (!bVar1) {
          bVar1 = _positive_negative_vine_swap(this,index);
          return bVar1;
        }
      }
      _positive_negative_transpose(this,index);
      _swap_at_index(this,index);
      this_local._7_1_ = true;
    }
  }
  else {
    pMVar7 = _matrix(this);
    DVar4 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
            ::get_column_dimension(&pMVar7->reducedMatrixR_,index);
    pMVar7 = _matrix(this);
    DVar5 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
            ::get_column_dimension(&pMVar7->reducedMatrixR_,index + 1);
    if (DVar4 == DVar5) {
      pMVar7 = _matrix(this);
      IVar6 = _get_row_id_from_position(this,index + 1);
      bVar1 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
              ::is_zero_entry(&pMVar7->mirrorMatrixU_,index,IVar6);
      if (!bVar1) {
        bVar1 = _negative_vine_swap(this,index);
        return bVar1;
      }
    }
    _negative_transpose(this,index);
    _swap_at_index(this,index);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::vine_swap(Pos_index index) 
{
  GUDHI_CHECK(index < _matrix()->reducedMatrixR_.get_number_of_columns() - 1,
              std::invalid_argument("RU_vine_swap::vine_swap - Index to swap out of bound."));

  bool iIsPositive = _matrix()->reducedMatrixR_.is_zero_column(index);
  bool iiIsPositive = _matrix()->reducedMatrixR_.is_zero_column(index + 1);

  if (iIsPositive && iiIsPositive) {
    if (_matrix()->reducedMatrixR_.get_column_dimension(index) !=
        _matrix()->reducedMatrixR_.get_column_dimension(index + 1)) {
      _positive_transpose(index);
      _swap_at_index(index);
      return true;
    }
    if (!_matrix()->mirrorMatrixU_.is_zero_entry(index, _get_row_id_from_position(index + 1))) {
      _matrix()->mirrorMatrixU_.zero_entry(index, _get_row_id_from_position(index + 1));
    }
    return _positive_vine_swap(index);
  } else if (!iIsPositive && !iiIsPositive) {
    if (_matrix()->reducedMatrixR_.get_column_dimension(index) !=
            _matrix()->reducedMatrixR_.get_column_dimension(index + 1) ||
        _matrix()->mirrorMatrixU_.is_zero_entry(index, _get_row_id_from_position(index + 1))) {
      _negative_transpose(index);
      _swap_at_index(index);
      return true;
    }
    return _negative_vine_swap(index);
  } else if (iIsPositive && !iiIsPositive) {
    if (_matrix()->reducedMatrixR_.get_column_dimension(index) !=
            _matrix()->reducedMatrixR_.get_column_dimension(index + 1) ||
        _matrix()->mirrorMatrixU_.is_zero_entry(index, _get_row_id_from_position(index + 1))) {
      _positive_negative_transpose(index);
      _swap_at_index(index);
      return true;
    }
    return _positive_negative_vine_swap(index);
  } else {
    if (_matrix()->reducedMatrixR_.get_column_dimension(index) !=
            _matrix()->reducedMatrixR_.get_column_dimension(index + 1) ||
        _matrix()->mirrorMatrixU_.is_zero_entry(index, _get_row_id_from_position(index + 1))) {
      _negative_positive_transpose(index);
      _swap_at_index(index);
      return true;
    }
    return _negative_positive_vine_swap(index);
  }
}